

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall xemmai::t_lexer::t_error::t_error(t_error *this,t_lexer *a_lexer)

{
  wstring *__str;
  t_at *ptVar1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> a_message;
  t_lexer *a_lexer_local;
  t_error *this_local;
  
  a_message = sv(L"lexical error.",0xe);
  t_throwable::t_throwable(&this->super_t_throwable,a_message);
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_error_002e59c0;
  __str = f_path_abi_cxx11_(a_lexer);
  std::__cxx11::wstring::wstring((wstring *)&this->v_path,__str);
  ptVar1 = f_at(a_lexer);
  (this->v_at).v_position = ptVar1->v_position;
  (this->v_at).v_line = ptVar1->v_line;
  (this->v_at).v_column = ptVar1->v_column;
  return;
}

Assistant:

t_error(t_lexer& a_lexer) : t_throwable(L"lexical error."sv), v_path(a_lexer.f_path()), v_at(a_lexer.f_at())
		{
		}